

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavInitWindow(ImGuiWindow *window,bool force_reinit)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  byte in_SIL;
  long in_RDI;
  bool init_for_nav;
  ImGuiContext *g;
  ImGuiNavLayer nav_layer;
  float in_stack_ffffffffffffffc4;
  float fStack_38;
  ImVec2 local_34;
  ImRect local_2c;
  char local_19;
  ImGuiContext *local_18;
  byte local_9;
  
  pIVar2 = GImGui;
  local_9 = in_SIL & 1;
  local_18 = GImGui;
  if ((*(uint *)(in_RDI + 0xc) & 0x40000) == 0) {
    local_19 = '\0';
    if ((((in_RDI == *(long *)(in_RDI + 0x350)) || ((*(uint *)(in_RDI + 0xc) & 0x4000000) != 0)) ||
        (*(int *)(in_RDI + 0x378) == 0)) || (local_9 != 0)) {
      local_19 = '\x01';
    }
    if (local_19 == '\0') {
      GImGui->NavId = *(ImGuiID *)(in_RDI + 0x378);
      pIVar2->NavFocusScopeId = 0;
    }
    else {
      nav_layer = GImGui->NavLayer;
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffffc4,nav_layer));
      SetNavID(0,nav_layer,0,&local_2c);
      local_18->NavInitRequest = true;
      local_18->NavInitRequestFromMove = false;
      local_18->NavInitResultId = 0;
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffffc4,nav_layer));
      IVar1.y = fStack_38;
      IVar1.x = in_stack_ffffffffffffffc4;
      (local_18->NavInitResultRectRel).Min = IVar1;
      (local_18->NavInitResultRectRel).Max = local_34;
      NavUpdateAnyRequestFlag();
    }
  }
  else {
    GImGui->NavFocusScopeId = 0;
    pIVar2->NavId = 0;
  }
  return;
}

Assistant:

void ImGui::NavInitWindow(ImGuiWindow* window, bool force_reinit)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == g.NavWindow);

    if (window->Flags & ImGuiWindowFlags_NoNavInputs)
    {
        g.NavId = g.NavFocusScopeId = 0;
        return;
    }

    bool init_for_nav = false;
    if (window == window->RootWindow || (window->Flags & ImGuiWindowFlags_Popup) || (window->NavLastIds[0] == 0) || force_reinit)
        init_for_nav = true;
    IMGUI_DEBUG_LOG_NAV("[nav] NavInitRequest: from NavInitWindow(), init_for_nav=%d, window=\"%s\", layer=%d\n", init_for_nav, window->Name, g.NavLayer);
    if (init_for_nav)
    {
        SetNavID(0, g.NavLayer, 0, ImRect());
        g.NavInitRequest = true;
        g.NavInitRequestFromMove = false;
        g.NavInitResultId = 0;
        g.NavInitResultRectRel = ImRect();
        NavUpdateAnyRequestFlag();
    }
    else
    {
        g.NavId = window->NavLastIds[0];
        g.NavFocusScopeId = 0;
    }
}